

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::buildTimeMap(MidiFile *this)

{
  int iVar1;
  int iVar2;
  pointer p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  MidiEvent *pMVar7;
  int anIndex;
  byte bVar8;
  _TickTime value;
  double local_58;
  double local_48;
  value_type local_40;
  
  iVar1 = this->m_theTrackState;
  iVar2 = this->m_theTimeState;
  makeAbsoluteTicks(this);
  joinTracks(this);
  anIndex = 0;
  iVar5 = getNumEvents(this,0);
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::reserve
            (&this->m_timemap,(long)(iVar5 + 10));
  p_Var3 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var3) {
    (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var3;
  }
  local_48 = 60.0 / ((double)this->m_ticksPerQuarterNote * 120.0);
  local_58 = 0.0;
  bVar8 = 0;
  iVar5 = 0;
  while( true ) {
    iVar6 = getNumEvents(this,0);
    if (iVar6 <= anIndex) break;
    pMVar7 = getEvent(this,0,anIndex);
    iVar6 = pMVar7->tick;
    pMVar7 = getEvent(this,0,anIndex);
    pMVar7->seconds = local_58;
    if (!(bool)(bVar8 & (iVar6 - iVar5 == 0 || iVar6 < iVar5))) {
      local_58 = local_58 + (double)(iVar6 - iVar5) * local_48;
      pMVar7 = getEvent(this,0,anIndex);
      pMVar7->seconds = local_58;
      local_40.tick = iVar6;
      local_40.seconds = local_58;
      std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::push_back
                (&this->m_timemap,&local_40);
      iVar5 = iVar6;
    }
    pMVar7 = getEvent(this,0,anIndex);
    bVar4 = MidiMessage::isTempo(&pMVar7->super_MidiMessage);
    if (bVar4) {
      pMVar7 = getEvent(this,0,anIndex);
      local_48 = MidiMessage::getTempoSPT(&pMVar7->super_MidiMessage,this->m_ticksPerQuarterNote);
    }
    anIndex = anIndex + 1;
    bVar8 = 1;
  }
  if (iVar2 == 0) {
    makeDeltaTicks(this);
  }
  if (iVar1 == 0) {
    splitTracks(this);
  }
  this->m_timemapvalid = true;
  return;
}

Assistant:

void MidiFile::buildTimeMap(void) {

	// convert the MIDI file to absolute time representation
	// in single track mode (and undo if the MIDI file was not
	// in that state when this function was called.
	//
	int trackstate = getTrackState();
	int timestate  = getTickState();

	makeAbsoluteTicks();
	joinTracks();

	int allocsize = getNumEvents(0);
	m_timemap.reserve(allocsize+10);
	m_timemap.clear();

	_TickTime value;

	int lasttick = 0;
	int tickinit = 0;

	int i;
	int tpq = getTicksPerQuarterNote();
	double defaultTempo = 120.0;
	double secondsPerTick = 60.0 / (defaultTempo * tpq);

	double lastsec = 0.0;
	double cursec = 0.0;

	for (i=0; i<getNumEvents(0); i++) {
		int curtick = getEvent(0, i).tick;
		getEvent(0, i).seconds = cursec;
		if ((curtick > lasttick) || !tickinit) {
			tickinit = 1;

			// calculate the current time in seconds:
			cursec = lastsec + (curtick - lasttick) * secondsPerTick;
			getEvent(0, i).seconds = cursec;

			// store the new tick to second mapping
			value.tick = curtick;
			value.seconds = cursec;
			m_timemap.push_back(value);
			lasttick   = curtick;
			lastsec    = cursec;
		}

		// update the tempo if needed:
		if (getEvent(0,i).isTempo()) {
			secondsPerTick = getEvent(0,i).getTempoSPT(getTicksPerQuarterNote());
		}
	}

	// reset the states of the tracks or time values if necessary here:
	if (timestate == TIME_STATE_DELTA) {
		deltaTicks();
	}
	if (trackstate == TRACK_STATE_SPLIT) {
		splitTracks();
	}

	m_timemapvalid = 1;

}